

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::RandomGroup::init(RandomGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  RenderContext *renderCtx;
  undefined8 name;
  int iVar1;
  bool bVar2;
  int i;
  uint uVar3;
  InputType IVar4;
  OutputType OVar5;
  deUint32 dVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  CompatibilityTestType CVar10;
  int extraout_EAX;
  long lVar11;
  iterator iVar12;
  DrawTest *this_00;
  int iVar13;
  int attrNdx;
  int iVar14;
  deUint32 hash;
  AttributeSpec attribSpec;
  size_t insertedCount;
  float local_1b8 [2];
  DrawTestSpec spec;
  string local_150;
  UniformWeightArray<3> indexTypeWeights;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> insertedHashes;
  UniformWeightArray<5> drawMethodWeights;
  UniformWeightArray<7> primitiveWeights;
  Random random;
  UniformWeightArray<9> usageWeights;
  UniformWeightArray<11> inputTypeWeights;
  UniformWeightArray<12> outputTypeWeights;
  
  for (lVar11 = 0; lVar11 != 7; lVar11 = lVar11 + 1) {
    primitiveWeights.weights[lVar11] = 1.0;
  }
  for (lVar11 = 0; lVar11 != 5; lVar11 = lVar11 + 1) {
    drawMethodWeights.weights[lVar11] = 1.0;
  }
  for (lVar11 = 0; lVar11 != 3; lVar11 = lVar11 + 1) {
    indexTypeWeights.weights[lVar11] = 1.0;
  }
  local_1b8[0] = 1.0;
  local_1b8[1] = 1.0;
  for (lVar11 = 0; lVar11 != 0xb; lVar11 = lVar11 + 1) {
    inputTypeWeights.weights[lVar11] = 1.0;
  }
  for (lVar11 = 0; lVar11 != 0xc; lVar11 = lVar11 + 1) {
    outputTypeWeights.weights[lVar11] = 1.0;
  }
  for (lVar11 = 0; lVar11 != 9; lVar11 = lVar11 + 1) {
    usageWeights.weights[lVar11] = 1.0;
  }
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  insertedCount = 0;
  iVar13 = 0;
  insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       insertedHashes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (iVar13 == 300) {
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::~_Rb_tree(&insertedHashes._M_t);
      return extraout_EAX;
    }
    deRandom_init(&random.m_rnd,iVar13 + 0xc551393);
    uVar3 = de::Random::chooseWeighted<int,int_const*,float_const*>
                      ((Random *)&random.m_rnd,init::attribCounts,(int *)init::attribWeights,
                       init::attribWeights);
    deqp::gls::DrawTestSpec::DrawTestSpec(&spec);
    spec.apiType.m_bits = 3;
    spec.primitive =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Primitive,deqp::gls::DrawTestSpec::Primitive_const*,float_const*>
                   ((Random *)&random.m_rnd,init::primitives,
                    (Primitive *)"N4deqp5gles310Functional12_GLOBAL__N_110FirstGroupE",
                    primitiveWeights.weights);
    spec.primitiveCount =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,init::primitiveCounts,(int *)init::primitiveCountWeights
                    ,init::primitiveCountWeights);
    spec.drawMethod =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::DrawMethod,deqp::gls::DrawTestSpec::DrawMethod_const*,float_const*>
                   ((Random *)&random.m_rnd,init::drawMethods,init::indexTypes,
                    drawMethodWeights.weights);
    spec.indexType =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::IndexType,deqp::gls::DrawTestSpec::IndexType_const*,float_const*>
                   ((Random *)&random.m_rnd,init::indexTypes,init::storages,indexTypeWeights.weights
                   );
    spec.indexPointerOffset =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,init::indexOffsets,(int *)init::indexOffsetWeights,
                    init::indexOffsetWeights);
    spec.indexStorage =
         de::Random::
         chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                   ((Random *)&random.m_rnd,init::storages,(Storage *)&DAT_01864778,local_1b8);
    spec.first = de::Random::chooseWeighted<int,int_const*,float_const*>
                           ((Random *)&random.m_rnd,init::firsts,(int *)init::firstWeights,
                            init::firstWeights);
    spec.indexMin =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,init::indexMins,init::indexMaxs,init::indexWeights);
    spec.indexMax =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,init::indexMaxs,(int *)init::indexWeights,
                    init::indexWeights);
    spec.instanceCount =
         de::Random::chooseWeighted<int,int_const*,float_const*>
                   ((Random *)&random.m_rnd,init::instanceCounts,(int *)init::instanceWeights,
                    init::instanceWeights);
    bVar2 = deqp::gls::DrawTestSpec::valid(&spec);
    if (bVar2) {
      iVar14 = 0;
LAB_010f575b:
      while (iVar14 < (int)uVar3) {
        deqp::gls::DrawTestSpec::AttributeSpec::AttributeSpec(&attribSpec);
        IVar4 = de::Random::
                chooseWeighted<deqp::gls::DrawTestSpec::InputType,deqp::gls::DrawTestSpec::InputType_const*,float_const*>
                          ((Random *)&random.m_rnd,init::inputTypes,(InputType *)&DAT_018647ac,
                           inputTypeWeights.weights);
        attribSpec.inputType = IVar4;
        OVar5 = de::Random::
                chooseWeighted<deqp::gls::DrawTestSpec::OutputType,deqp::gls::DrawTestSpec::OutputType_const*,float_const*>
                          ((Random *)&random.m_rnd,init::outputTypes,init::usages,
                           outputTypeWeights.weights);
        attribSpec.outputType = OVar5;
        attribSpec.storage =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Storage,deqp::gls::DrawTestSpec::Storage_const*,float_const*>
                       ((Random *)&random.m_rnd,init::storages,(Storage *)&DAT_01864778,local_1b8);
        attribSpec.usage =
             de::Random::
             chooseWeighted<deqp::gls::DrawTestSpec::Usage,deqp::gls::DrawTestSpec::Usage_const*,float_const*>
                       ((Random *)&random.m_rnd,init::usages,init::blacklistedCases,
                        usageWeights.weights);
        dVar6 = deRandom_getUint32(&random.m_rnd);
        attribSpec.componentCount = (dVar6 & 3) + 1;
        attribSpec.offset =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)&random.m_rnd,init::offsets,(int *)init::offsetWeights,
                        init::offsetWeights);
        attribSpec.stride =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)&random.m_rnd,init::strides,(int *)init::strideWeights,
                        init::strideWeights);
        attribSpec.normalize = de::Random::getBool((Random *)&random.m_rnd);
        attribSpec.instanceDivisor =
             de::Random::chooseWeighted<int,int_const*,float_const*>
                       ((Random *)&random.m_rnd,init::instanceDivisors,
                        (int *)init::instanceDivisorWeights,init::instanceDivisorWeights);
        attribSpec.useDefaultAttribute = de::Random::getBool((Random *)&random.m_rnd);
        bVar2 = deqp::gls::DrawTestSpec::AttributeSpec::valid(&attribSpec,spec.apiType);
        iVar1 = attribSpec.componentCount;
        if (attribSpec.stride == 0) goto LAB_010f58ba;
        iVar7 = deqp::gls::DrawTestSpec::inputTypeSize(attribSpec.inputType);
        if (bVar2 && iVar7 * iVar1 <= attribSpec.stride) goto LAB_010f58bf;
      }
      if (spec.primitive != PRIMITIVE_POINTS) {
        (spec.attribs.
         super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
         ._M_impl.super__Vector_impl_data._M_start)->instanceDivisor = 0;
      }
      if (((((spec.drawMethod != DRAWMETHOD_DRAWELEMENTS_RANGED) ||
            (spec.primitive == PRIMITIVE_POINTS)) || (spec.indexMin != spec.indexMax)) &&
          ((spec.primitive == PRIMITIVE_POINTS ||
           ((spec.attribs.
             super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
             ._M_impl.super__Vector_impl_data._M_start)->useDefaultAttribute == false)))) &&
         ((2 < spec.primitive - PRIMITIVE_TRIANGLES ||
          ((((spec.attribs.
              super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
              ._M_impl.super__Vector_impl_data._M_start)->componentCount != 1 &&
            ((OUTPUTTYPE_UINT <
              (spec.attribs.
               super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
               ._M_impl.super__Vector_impl_data._M_start)->outputType ||
             ((0x31U >> ((spec.attribs.
                          super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                          ._M_impl.super__Vector_impl_data._M_start)->outputType & 0x1f) & 1) == 0))
            )) && ((spec.drawMethod != DRAWMETHOD_DRAWELEMENTS_RANGED ||
                   (1 < spec.indexMax - spec.indexMin)))))))) {
        uVar8 = deqp::gls::DrawTestSpec::hash(&spec);
        if ((int)uVar3 < 1) {
          uVar3 = 0;
        }
        for (lVar11 = 0; hash = uVar8, (ulong)uVar3 * 0x28 - lVar11 != 0; lVar11 = lVar11 + 0x28) {
          uVar9 = deqp::gls::DrawTestSpec::AttributeSpec::hash
                            ((AttributeSpec *)
                             ((long)&(spec.attribs.
                                      super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->inputType + lVar11
                             ));
          uVar8 = uVar8 << 2 ^ uVar9;
        }
        iVar12 = std::
                 _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
                 ::find(&insertedHashes._M_t,&hash);
        if ((_Rb_tree_header *)iVar12._M_node == &insertedHashes._M_t._M_impl.super__Rb_tree_header)
        {
          CVar10 = deqp::gls::DrawTestSpec::isCompatibilityTest(&spec);
          if ((CVar10 != COMPATIBILITY_UNALIGNED_OFFSET) &&
             (CVar10 = deqp::gls::DrawTestSpec::isCompatibilityTest(&spec),
             CVar10 != COMPATIBILITY_UNALIGNED_STRIDE)) {
            attribSpec._0_8_ = init::blacklistedCases;
            local_150._M_dataplus._M_p = "";
            bVar2 = de::contains<unsigned_int_const*,unsigned_int>
                              ((uint **)&attribSpec,(uint **)&local_150,&hash);
            if (!bVar2) {
              this_00 = (DrawTest *)operator_new(0x138);
              testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
              renderCtx = ((this->super_TestCaseGroup).m_context)->m_renderCtx;
              de::toString<unsigned_long>((string *)&attribSpec,&insertedCount);
              name = attribSpec._0_8_;
              deqp::gls::DrawTestSpec::getDesc_abi_cxx11_(&local_150,&spec);
              deqp::gls::DrawTest::DrawTest
                        (this_00,testCtx,renderCtx,&spec,(char *)name,local_150._M_dataplus._M_p);
              tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
              std::__cxx11::string::~string((string *)&local_150);
              std::__cxx11::string::~string((string *)&attribSpec);
            }
          }
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)&insertedHashes,&hash);
          insertedCount = insertedCount + 1;
        }
      }
    }
    std::
    _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ::~_Vector_base(&spec.attribs.
                     super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                   );
    iVar13 = iVar13 + 1;
  } while( true );
LAB_010f58ba:
  if (bVar2) {
LAB_010f58bf:
    std::
    vector<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
    ::push_back(&spec.attribs,&attribSpec);
    iVar14 = iVar14 + 1;
  }
  goto LAB_010f575b;
}

Assistant:

void RandomGroup::init (void)
{
	const int			numAttempts				= 300;

	static const int	attribCounts[]			= { 1, 2, 5 };
	static const float	attribWeights[]			= { 30, 10, 1 };
	static const int	primitiveCounts[]		= { 1, 5, 64 };
	static const float	primitiveCountWeights[]	= { 20, 10, 1 };
	static const int	indexOffsets[]			= { 0, 7, 13 };
	static const float	indexOffsetWeights[]	= { 20, 20, 1 };
	static const int	firsts[]				= { 0, 7, 13 };
	static const float	firstWeights[]			= { 20, 20, 1 };
	static const int	instanceCounts[]		= { 1, 2, 16, 17 };
	static const float	instanceWeights[]		= { 20, 10, 5, 1 };
	static const int	indexMins[]				= { 0, 1, 3, 8 };
	static const int	indexMaxs[]				= { 4, 8, 128, 257 };
	static const float	indexWeights[]			= { 50, 50, 50, 50 };
	static const int	offsets[]				= { 0, 1, 5, 12 };
	static const float	offsetWeights[]			= { 50, 10, 10, 10 };
	static const int	strides[]				= { 0, 7, 16, 17 };
	static const float	strideWeights[]			= { 50, 10, 10, 10 };
	static const int	instanceDivisors[]		= { 0, 1, 3, 129 };
	static const float	instanceDivisorWeights[]= { 70, 30, 10, 10 };

	static const gls::DrawTestSpec::Primitive primitives[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(primitives)> primitiveWeights;

	static const gls::DrawTestSpec::DrawMethod drawMethods[] =
	{
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED,
		gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(drawMethods)> drawMethodWeights;

	static const gls::DrawTestSpec::IndexType indexTypes[] =
	{
		gls::DrawTestSpec::INDEXTYPE_BYTE,
		gls::DrawTestSpec::INDEXTYPE_SHORT,
		gls::DrawTestSpec::INDEXTYPE_INT,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(indexTypes)> indexTypeWeights;

	static const gls::DrawTestSpec::Storage storages[] =
	{
		gls::DrawTestSpec::STORAGE_USER,
		gls::DrawTestSpec::STORAGE_BUFFER,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(storages)> storageWeights;

	static const gls::DrawTestSpec::InputType inputTypes[] =
	{
		gls::DrawTestSpec::INPUTTYPE_FLOAT,
		gls::DrawTestSpec::INPUTTYPE_FIXED,
		gls::DrawTestSpec::INPUTTYPE_BYTE,
		gls::DrawTestSpec::INPUTTYPE_SHORT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_BYTE,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_SHORT,
		gls::DrawTestSpec::INPUTTYPE_INT,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT,
		gls::DrawTestSpec::INPUTTYPE_HALF,
		gls::DrawTestSpec::INPUTTYPE_UNSIGNED_INT_2_10_10_10,
		gls::DrawTestSpec::INPUTTYPE_INT_2_10_10_10,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(inputTypes)> inputTypeWeights;

	static const gls::DrawTestSpec::OutputType outputTypes[] =
	{
		gls::DrawTestSpec::OUTPUTTYPE_FLOAT,
		gls::DrawTestSpec::OUTPUTTYPE_VEC2,
		gls::DrawTestSpec::OUTPUTTYPE_VEC3,
		gls::DrawTestSpec::OUTPUTTYPE_VEC4,
		gls::DrawTestSpec::OUTPUTTYPE_INT,
		gls::DrawTestSpec::OUTPUTTYPE_UINT,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_IVEC4,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC2,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC3,
		gls::DrawTestSpec::OUTPUTTYPE_UVEC4,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(outputTypes)> outputTypeWeights;

	static const gls::DrawTestSpec::Usage usages[] =
	{
		gls::DrawTestSpec::USAGE_DYNAMIC_DRAW,
		gls::DrawTestSpec::USAGE_STATIC_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_DRAW,
		gls::DrawTestSpec::USAGE_STREAM_READ,
		gls::DrawTestSpec::USAGE_STREAM_COPY,
		gls::DrawTestSpec::USAGE_STATIC_READ,
		gls::DrawTestSpec::USAGE_STATIC_COPY,
		gls::DrawTestSpec::USAGE_DYNAMIC_READ,
		gls::DrawTestSpec::USAGE_DYNAMIC_COPY,
	};
	const UniformWeightArray<DE_LENGTH_OF_ARRAY(usages)> usageWeights;

	static const deUint32 blacklistedCases[]=
	{
		544,	//!< extremely narrow triangle
	};

	std::set<deUint32>	insertedHashes;
	size_t				insertedCount = 0;

	for (int ndx = 0; ndx < numAttempts; ++ndx)
	{
		de::Random random(0xc551393 + ndx); // random does not depend on previous cases

		int					attributeCount = random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(attribCounts), DE_ARRAY_END(attribCounts), attribWeights);
		gls::DrawTestSpec	spec;

		spec.apiType				= glu::ApiType::es(3,0);
		spec.primitive				= random.chooseWeighted<gls::DrawTestSpec::Primitive>	(DE_ARRAY_BEGIN(primitives),		DE_ARRAY_END(primitives),		primitiveWeights.weights);
		spec.primitiveCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(primitiveCounts),	DE_ARRAY_END(primitiveCounts),	primitiveCountWeights);
		spec.drawMethod				= random.chooseWeighted<gls::DrawTestSpec::DrawMethod>	(DE_ARRAY_BEGIN(drawMethods),		DE_ARRAY_END(drawMethods),		drawMethodWeights.weights);
		spec.indexType				= random.chooseWeighted<gls::DrawTestSpec::IndexType>	(DE_ARRAY_BEGIN(indexTypes),		DE_ARRAY_END(indexTypes),		indexTypeWeights.weights);
		spec.indexPointerOffset		= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexOffsets),		DE_ARRAY_END(indexOffsets),		indexOffsetWeights);
		spec.indexStorage			= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
		spec.first					= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(firsts),			DE_ARRAY_END(firsts),			firstWeights);
		spec.indexMin				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMins),			DE_ARRAY_END(indexMins),		indexWeights);
		spec.indexMax				= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(indexMaxs),			DE_ARRAY_END(indexMaxs),		indexWeights);
		spec.instanceCount			= random.chooseWeighted<int, const int*, const float*>	(DE_ARRAY_BEGIN(instanceCounts),	DE_ARRAY_END(instanceCounts),	instanceWeights);

		// check spec is legal
		if (!spec.valid())
			continue;

		for (int attrNdx = 0; attrNdx < attributeCount;)
		{
			bool valid;
			gls::DrawTestSpec::AttributeSpec attribSpec;

			attribSpec.inputType			= random.chooseWeighted<gls::DrawTestSpec::InputType>	(DE_ARRAY_BEGIN(inputTypes),		DE_ARRAY_END(inputTypes),		inputTypeWeights.weights);
			attribSpec.outputType			= random.chooseWeighted<gls::DrawTestSpec::OutputType>	(DE_ARRAY_BEGIN(outputTypes),		DE_ARRAY_END(outputTypes),		outputTypeWeights.weights);
			attribSpec.storage				= random.chooseWeighted<gls::DrawTestSpec::Storage>		(DE_ARRAY_BEGIN(storages),			DE_ARRAY_END(storages),			storageWeights.weights);
			attribSpec.usage				= random.chooseWeighted<gls::DrawTestSpec::Usage>		(DE_ARRAY_BEGIN(usages),			DE_ARRAY_END(usages),			usageWeights.weights);
			attribSpec.componentCount		= random.getInt(1, 4);
			attribSpec.offset				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(offsets), DE_ARRAY_END(offsets), offsetWeights);
			attribSpec.stride				= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(strides), DE_ARRAY_END(strides), strideWeights);
			attribSpec.normalize			= random.getBool();
			attribSpec.instanceDivisor		= random.chooseWeighted<int, const int*, const float*>(DE_ARRAY_BEGIN(instanceDivisors), DE_ARRAY_END(instanceDivisors), instanceDivisorWeights);
			attribSpec.useDefaultAttribute	= random.getBool();

			// check spec is legal
			valid = attribSpec.valid(spec.apiType);

			// we do not want interleaved elements. (Might result in some weird floating point values)
			if (attribSpec.stride && attribSpec.componentCount * gls::DrawTestSpec::inputTypeSize(attribSpec.inputType) > attribSpec.stride)
				valid = false;

			// try again if not valid
			if (valid)
			{
				spec.attribs.push_back(attribSpec);
				++attrNdx;
			}
		}

		// Do not collapse all vertex positions to a single positions
		if (spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
			spec.attribs[0].instanceDivisor = 0;

		// Is render result meaningful?
		{
			// Only one vertex
			if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && spec.indexMin == spec.indexMax && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;
			if (spec.attribs[0].useDefaultAttribute && spec.primitive != gls::DrawTestSpec::PRIMITIVE_POINTS)
				continue;

			// Triangle only on one axis
			if (spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLES || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN || spec.primitive == gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP)
			{
				if (spec.attribs[0].componentCount == 1)
					continue;
				if (spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_FLOAT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_INT || spec.attribs[0].outputType == gls::DrawTestSpec::OUTPUTTYPE_UINT)
					continue;
				if (spec.drawMethod == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED && (spec.indexMax - spec.indexMin) < 2)
					continue;
			}
		}

		// Add case
		{
			deUint32 hash = spec.hash();
			for (int attrNdx = 0; attrNdx < attributeCount; ++attrNdx)
				hash = (hash << 2) ^ (deUint32)spec.attribs[attrNdx].hash();

			if (insertedHashes.find(hash) == insertedHashes.end())
			{
				// Only properly aligned and not blacklisted cases
				if (spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET			&&
					spec.isCompatibilityTest() != gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE			&&
					!de::contains(DE_ARRAY_BEGIN(blacklistedCases), DE_ARRAY_END(blacklistedCases), hash))
				{
					this->addChild(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), spec, de::toString(insertedCount).c_str(), spec.getDesc().c_str()));
				}
				insertedHashes.insert(hash);

				++insertedCount;
			}
		}
	}
}